

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O1

void sfd_tran_pipe_recv_start(sfd_tran_pipe *p)

{
  nni_list *list;
  int iVar1;
  nni_aio *aio;
  undefined1 local_28 [8];
  nni_iov iov;
  
  if (p->rxmsg != (nni_msg *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd.c"
              ,500,"p->rxmsg == NULL");
  }
  list = &p->recvq;
  if (p->closed == true) {
    aio = (nni_aio *)nni_list_first(list);
    while (aio != (nni_aio *)0x0) {
      nni_list_remove(list,aio);
      nni_aio_finish_error(aio,NNG_ECLOSED);
      aio = (nni_aio *)nni_list_first(list);
    }
  }
  else {
    iVar1 = nni_list_empty(list);
    if (iVar1 == 0) {
      local_28 = (undefined1  [8])p->rxlen;
      iov.iov_buf = (void *)0x8;
      nni_aio_set_iov(&p->rxaio,1,(nni_iov *)local_28);
      nng_stream_recv(p->conn,&p->rxaio);
    }
  }
  return;
}

Assistant:

static void
sfd_tran_pipe_recv_start(sfd_tran_pipe *p)
{
	nni_aio *rxaio;
	nni_iov  iov;
	NNI_ASSERT(p->rxmsg == NULL);

	if (p->closed) {
		nni_aio *aio;
		while ((aio = nni_list_first(&p->recvq)) != NULL) {
			nni_list_remove(&p->recvq, aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		return;
	}
	if (nni_list_empty(&p->recvq)) {
		return;
	}

	// Schedule a read of the header.
	rxaio       = &p->rxaio;
	iov.iov_buf = p->rxlen;
	iov.iov_len = sizeof(p->rxlen);
	nni_aio_set_iov(rxaio, 1, &iov);

	nng_stream_recv(p->conn, rxaio);
}